

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkCompareSupports(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t **ppAVar4;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pObj = Abc_NtkObj(pNtk,i);
      if (pObj != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_AigNodeIsAnd(pObj);
        if (iVar2 != 0) {
          iVar2 = Abc_AigNodeIsChoice(pObj);
          if (iVar2 != 0) {
            pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
            uVar1 = pVVar3->nSize;
            Vec_PtrFree(pVVar3);
            ppAVar4 = &pObj;
            while (local_38 = (Abc_Obj_t *)((*ppAVar4)->field_5).pData, local_38 != (Abc_Obj_t *)0x0
                  ) {
              pVVar3 = Abc_NtkNodeSupport(pNtk,&local_38,1);
              if (uVar1 != pVVar3->nSize) {
                printf("Choice orig = %3d  Choice new = %3d\n",(ulong)uVar1);
              }
              Vec_PtrFree(pVVar3);
              ppAVar4 = &local_38;
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,0x888,"void Abc_NtkCompareSupports(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkCompareSupports( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, nNodesOld;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nNodesOld = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );

        for ( pTemp = (Abc_Obj_t *)pObj->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
        {
            vSupp = Abc_NtkNodeSupport( pNtk, &pTemp, 1 );
            if ( nNodesOld != Vec_PtrSize(vSupp) )
                printf( "Choice orig = %3d  Choice new = %3d\n", nNodesOld, Vec_PtrSize(vSupp) );
            Vec_PtrFree( vSupp );
        }
    }
}